

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void Js::SetUNumberFormatDigitOptions(UNumberFormat *fmt,DynamicObject *state)

{
  DynamicObject *pDVar1;
  DynamicObject *pDVar2;
  BOOL BVar3;
  int iVar4;
  PropertyIds local_2c;
  PropertyIds local_28;
  PropertyIds local_24;
  PropertyIds local_20;
  PropertyIds local_1c;
  DynamicObject *local_18;
  DynamicObject *state_local;
  UNumberFormat *fmt_local;
  
  local_18 = state;
  state_local = (DynamicObject *)fmt;
  BVar3 = JavascriptOperators::HasProperty(&state->super_RecyclableObject,0x248);
  pDVar2 = state_local;
  pDVar1 = local_18;
  if (BVar3 == 0) {
    PropertyIds::PropertyIds(&local_24,minimumIntegerDigits);
    iVar4 = AssertIntegerProperty(pDVar1,local_24);
    unum_setAttribute_70(pDVar2,4,iVar4);
    pDVar2 = state_local;
    pDVar1 = local_18;
    PropertyIds::PropertyIds(&local_28,minimumFractionDigits);
    iVar4 = AssertIntegerProperty(pDVar1,local_28);
    unum_setAttribute_70(pDVar2,7,iVar4);
    pDVar2 = state_local;
    pDVar1 = local_18;
    PropertyIds::PropertyIds(&local_2c,maximumFractionDigits);
    iVar4 = AssertIntegerProperty(pDVar1,local_2c);
    unum_setAttribute_70(pDVar2,6,iVar4);
  }
  else {
    unum_setAttribute_70(state_local,0x10,1);
    pDVar2 = state_local;
    pDVar1 = local_18;
    PropertyIds::PropertyIds(&local_1c,minimumSignificantDigits);
    iVar4 = AssertIntegerProperty(pDVar1,local_1c);
    unum_setAttribute_70(pDVar2,0x11,iVar4);
    pDVar2 = state_local;
    pDVar1 = local_18;
    PropertyIds::PropertyIds(&local_20,maximumSignificantDigits);
    iVar4 = AssertIntegerProperty(pDVar1,local_20);
    unum_setAttribute_70(pDVar2,0x12,iVar4);
  }
  return;
}

Assistant:

static void SetUNumberFormatDigitOptions(UNumberFormat *fmt, DynamicObject *state)
    {
        if (JavascriptOperators::HasProperty(state, PropertyIds::minimumSignificantDigits))
        {
            unum_setAttribute(fmt, UNUM_SIGNIFICANT_DIGITS_USED, true);
            unum_setAttribute(fmt, UNUM_MIN_SIGNIFICANT_DIGITS, AssertIntegerProperty(state, PropertyIds::minimumSignificantDigits));
            unum_setAttribute(fmt, UNUM_MAX_SIGNIFICANT_DIGITS, AssertIntegerProperty(state, PropertyIds::maximumSignificantDigits));
        }
        else
        {
            unum_setAttribute(fmt, UNUM_MIN_INTEGER_DIGITS, AssertIntegerProperty(state, PropertyIds::minimumIntegerDigits));
            unum_setAttribute(fmt, UNUM_MIN_FRACTION_DIGITS, AssertIntegerProperty(state, PropertyIds::minimumFractionDigits));
            unum_setAttribute(fmt, UNUM_MAX_FRACTION_DIGITS, AssertIntegerProperty(state, PropertyIds::maximumFractionDigits));
        }
    }